

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_score_graph.cpp
# Opt level: O3

void trt_pose::parse::paf_score_graph_out_hw
               (float *score_graph,float *paf_i,float *paf_j,int counts_a,int counts_b,
               float *peaks_a,float *peaks_b,int H,int W,int M,int num_integral_samples)

{
  undefined1 auVar1 [16];
  float fVar2;
  int unaff_EBX;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  
  if (0 < counts_a) {
    uVar5 = 0;
    do {
      if (0 < counts_b) {
        fVar6 = (float)*(undefined8 *)(peaks_a + uVar5 * 2) * (float)H;
        fVar7 = (float)((ulong)*(undefined8 *)(peaks_a + uVar5 * 2) >> 0x20) * (float)W;
        uVar4 = 0;
        do {
          fVar8 = (float)*(undefined8 *)(peaks_b + uVar4 * 2) * (float)H - fVar6;
          fVar9 = (float)((ulong)*(undefined8 *)(peaks_b + uVar4 * 2) >> 0x20) * (float)W - fVar7;
          fVar2 = SQRT(fVar8 * fVar8 + fVar9 * fVar9) + 1e-05;
          if (num_integral_samples < 1) {
            fVar10 = 0.0;
          }
          else {
            iVar3 = 0;
            fVar10 = 0.0;
            do {
              fVar11 = (float)iVar3 / ((float)num_integral_samples + -1.0);
              iVar12 = (int)(fVar11 * fVar8 + fVar6);
              iVar13 = (int)(fVar11 * fVar9 + fVar7);
              auVar1._4_4_ = -(uint)(iVar13 < W);
              auVar1._0_4_ = -(uint)(iVar12 < H);
              auVar1._8_4_ = -(uint)(-1 < iVar12);
              auVar1._12_4_ = -(uint)(-1 < iVar13);
              unaff_EBX = movmskps(unaff_EBX,auVar1);
              if (unaff_EBX == 0xf) {
                unaff_EBX = iVar12 * W;
                fVar10 = fVar10 + paf_i[(uint)(iVar13 + unaff_EBX)] * (fVar8 / fVar2) +
                                  paf_j[(uint)(iVar13 + unaff_EBX)] * (fVar9 / fVar2);
              }
              iVar3 = iVar3 + 1;
            } while (num_integral_samples != iVar3);
          }
          score_graph[uVar5 * (long)M + uVar4] = fVar10 / (float)num_integral_samples;
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)counts_b);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)counts_a);
  }
  return;
}

Assistant:

void paf_score_graph_out_hw(float *score_graph, // MxM
                            const float *paf_i, // HxW
                            const float *paf_j, // HxW
                            const int counts_a, const int counts_b,
                            const float *peaks_a, // Mx2
                            const float *peaks_b, // Mx2
                            const int H, const int W, const int M,
                            const int num_integral_samples) {
  for (int a = 0; a < counts_a; a++) {
    // compute point A
    float pa_i = peaks_a[a * 2] * H;
    float pa_j = peaks_a[a * 2 + 1] * W;

    for (int b = 0; b < counts_b; b++) {
      // compute point B
      float pb_i = peaks_b[b * 2] * H;
      float pb_j = peaks_b[b * 2 + 1] * W;

      // compute vector A->B
      float pab_i = pb_i - pa_i;
      float pab_j = pb_j - pa_j;

      // compute normalized vector A->B
      float pab_norm = sqrtf(pab_i * pab_i + pab_j * pab_j) + EPS;
      float uab_i = pab_i / pab_norm;
      float uab_j = pab_j / pab_norm;

      float integral = 0.;
      float increment = 1.f / num_integral_samples;

      for (int t = 0; t < num_integral_samples; t++) {
        // compute integral point T
        float progress = (float)t / ((float)num_integral_samples - 1);
        float pt_i = pa_i + progress * pab_i;
        float pt_j = pa_j + progress * pab_j;

        // convert to int
        // note: we do not need to subtract 0.5 when indexing, because
        // round(x - 0.5) = int(x)
        int pt_i_int = (int)pt_i;
        int pt_j_int = (int)pt_j;

        // skip point if out of bounds (will weaken integral)
        if (pt_i_int < 0)
          continue;
        if (pt_i_int >= H)
          continue;
        if (pt_j_int < 0)
          continue;
        if (pt_j_int >= W)
          continue;

        // get vector at integral point from PAF
        float pt_paf_i = paf_i[pt_i_int * W + pt_j_int];
        float pt_paf_j = paf_j[pt_i_int * W + pt_j_int];

        // compute dot product of normalized A->B with PAF vector at integral
        // point
        float dot = pt_paf_i * uab_i + pt_paf_j * uab_j;
        integral += dot;
      }

      integral /= num_integral_samples;
      score_graph[a * M + b] = integral;
    }
  }
}